

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::~StreamingReporterBase
          (StreamingReporterBase<Catch::TestEventListenerBase> *this)

{
  StreamingReporterBase<Catch::TestEventListenerBase> *this_local;
  
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__StreamingReporterBase_00271170;
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&this->m_sectionStack);
  LazyStat<Catch::TestCaseInfo>::~LazyStat(&this->currentTestCaseInfo);
  LazyStat<Catch::GroupInfo>::~LazyStat(&this->currentGroupInfo);
  LazyStat<Catch::TestRunInfo>::~LazyStat(&this->currentTestRunInfo);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&this->m_config);
  IStreamingReporter::~IStreamingReporter(&this->super_IStreamingReporter);
  return;
}

Assistant:

~StreamingReporterBase() override = default;